

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O3

int h264_scaling_list(bitstream *str,uint32_t *scaling_list,int size,uint32_t *use_default_flag)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  long in_RAX;
  ulong uVar5;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (str->dir == VS_DECODE) {
    if (size < 1) {
      return 0;
    }
    uVar2 = 8;
    uVar5 = 0;
    uVar4 = 8;
    do {
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        iVar1 = vs_se(str,(int32_t *)&local_38);
        if (iVar1 != 0) {
          return 1;
        }
        uVar2 = (int)local_38 + uVar4 & 0xff;
        *use_default_flag = (uint)((int)uVar5 == 0 && uVar2 == 0);
        if (uVar2 != 0) {
          uVar4 = uVar2;
        }
      }
      scaling_list[uVar5] = uVar4;
      uVar5 = uVar5 + 1;
    } while ((uint)size != uVar5);
    return 0;
  }
  uVar4 = 0;
  iVar1 = 0;
  if (*use_default_flag == 0) {
    iVar1 = size;
  }
  if (iVar1 < 2) {
    uVar3 = 8;
    uVar2 = 1;
    if (iVar1 != 1) goto LAB_00102771;
  }
  else {
    uVar5 = (ulong)(uint)size;
    do {
      uVar2 = (uint)uVar5;
      if (scaling_list[uVar5 - 1] != scaling_list[uVar5 - 2]) goto LAB_0010271e;
      uVar5 = (ulong)(uVar2 - 1);
    } while (2 < (int)uVar2);
    uVar2 = 1;
  }
LAB_0010271e:
  local_38 = (ulong)(uint)size << 0x20;
  uVar3 = 8;
  uVar5 = 0;
  do {
    uVar4 = scaling_list[uVar5] - uVar3 & 0xff;
    local_38 = CONCAT44(local_38._4_4_,uVar4 + (uint)(uVar4 < 0x80) * 0x100 + -0x100);
    iVar1 = vs_se(str,(int32_t *)&local_38);
    if (iVar1 != 0) {
      return 1;
    }
    uVar3 = scaling_list[uVar5];
    uVar5 = uVar5 + 1;
  } while (uVar2 != uVar5);
  size = local_38._4_4_;
  uVar4 = uVar2;
LAB_00102771:
  if (uVar4 != size) {
    local_38 = CONCAT44(local_38._4_4_,
                        (-uVar3 & 0xff) + (uint)((-uVar3 & 0xff) < 0x80) * 0x100 + -0x100);
    iVar1 = vs_se(str,(int32_t *)&local_38);
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int h264_scaling_list(struct bitstream *str, uint32_t *scaling_list, int size, uint32_t *use_default_flag) {
	uint32_t lastScale = 8;
	uint32_t nextScale = 8;
	int32_t delta_scale;
	int i;
	if (str->dir == VS_DECODE) {
		for (i = 0; i < size; i++) {
			if (nextScale != 0) {
				if (vs_se(str, &delta_scale)) return 1;
				nextScale = (lastScale + delta_scale + 256)%256;
				*use_default_flag = (i == 0 && nextScale == 0);
			}
			lastScale = scaling_list[i] = (nextScale?nextScale:lastScale);
		}
	} else {
		int haltidx = size;
		if (*use_default_flag)
			haltidx = 0;
		while (haltidx >= 2 && scaling_list[haltidx-1] == scaling_list[haltidx-2])
			haltidx--;
		for (i = 0; i < haltidx; i++) {
			delta_scale = (scaling_list[i] - lastScale + 256)%256;
			if (delta_scale >= 128)
				delta_scale -= 256;
			if (vs_se(str, &delta_scale)) return 1;
			lastScale = scaling_list[i];
		}
		if (i != size) {
			delta_scale = (0 - lastScale + 256)%256;
			if (delta_scale >= 128)
				delta_scale -= 256;
			if (vs_se(str, &delta_scale)) return 1;
		}
	}
	return 0;
}